

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

bool slang::ast::Expression::checkConnectionDirection
               (Expression *expr,ArgumentDirection direction,ASTContext *context,SourceLocation loc,
               bitmask<slang::ast::AssignFlags> flags)

{
  undefined1 uVar1;
  uint in_ESI;
  
  uVar1 = (*(code *)(&DAT_015f0adc + *(int *)(&DAT_015f0adc + (ulong)in_ESI * 4)))();
  return (bool)uVar1;
}

Assistant:

bool Expression::checkConnectionDirection(const Expression& expr, ArgumentDirection direction,
                                          const ASTContext& context, SourceLocation loc,
                                          bitmask<AssignFlags> flags) {
    switch (direction) {
        case ArgumentDirection::In:
            // All expressions are fine for inputs.
            return true;
        case ArgumentDirection::Out:
            return expr.requireLValue(context, loc, flags);
        case ArgumentDirection::InOut:
            return expr.requireLValue(context, loc, flags | AssignFlags::InOutPort);
        case ArgumentDirection::Ref:
            if (!canConnectToRefArg(context, expr, VariableFlags::None)) {
                context.addDiag(diag::InvalidRefArg, loc) << expr.sourceRange;
                return false;
            }
            return true;
    }
    SLANG_UNREACHABLE;
}